

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

void __thiscall serialization::xml_iarchive::load<int>(xml_iarchive *this,int *v)

{
  char *pcVar1;
  _Elt_pointer ppxVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *__s;
  stringstream ss;
  long local_1a0 [2];
  ostream local_190 [16];
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pcVar1 = (ppxVar2[-1]->super_xml_base<char>).m_value;
  __s = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,__s,sVar3);
  std::istream::operator>>((istream *)local_1a0,v);
  if ((abStack_180[*(long *)(local_1a0[0] + -0x18)] & 2) != 0) {
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar4 = &PTR__exception_00120d50;
  puVar4[1] = "xml";
  puVar4[2] = "load ";
  __cxa_throw(puVar4,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void load(T & v) const
    {
        std::stringstream ss;
        ss << stack_.top()->value();
        ss >> v;
        if(!ss.eof())
        {
            throw_serialization_error("load ", "xml");
        }
    }